

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

FBehavior * FBehavior::StaticLoadModule(int lumpnum,FileReader *fr,int len)

{
  bool bVar1;
  uint uVar2;
  FBehavior **ppFVar3;
  char *pcVar4;
  FBehavior *behavior;
  uint i;
  int len_local;
  FileReader *fr_local;
  FBehavior *pFStack_10;
  int lumpnum_local;
  
  if ((lumpnum == -1) && (fr == (FileReader *)0x0)) {
    pFStack_10 = (FBehavior *)0x0;
  }
  else {
    for (behavior._0_4_ = 0; uVar2 = TArray<FBehavior_*,_FBehavior_*>::Size(&StaticModules),
        (uint)behavior < uVar2; behavior._0_4_ = (uint)behavior + 1) {
      ppFVar3 = TArray<FBehavior_*,_FBehavior_*>::operator[](&StaticModules,(ulong)(uint)behavior);
      if ((*ppFVar3)->LumpNum == lumpnum) {
        ppFVar3 = TArray<FBehavior_*,_FBehavior_*>::operator[](&StaticModules,(ulong)(uint)behavior)
        ;
        return *ppFVar3;
      }
    }
    pFStack_10 = (FBehavior *)operator_new(0x698);
    FBehavior(pFStack_10);
    bVar1 = Init(pFStack_10,lumpnum,fr,len);
    if (!bVar1) {
      if (pFStack_10 != (FBehavior *)0x0) {
        ~FBehavior(pFStack_10);
        operator_delete(pFStack_10,0x698);
      }
      pcVar4 = FWadCollection::GetLumpFullName(&Wads,lumpnum);
      Printf("\x1cG%s: invalid ACS module\n",pcVar4);
      pFStack_10 = (FBehavior *)0x0;
    }
  }
  return pFStack_10;
}

Assistant:

FBehavior *FBehavior::StaticLoadModule (int lumpnum, FileReader *fr, int len)
{
	if (lumpnum == -1 && fr == NULL) return NULL;

	for (unsigned int i = 0; i < StaticModules.Size(); ++i)
	{
		if (StaticModules[i]->LumpNum == lumpnum)
		{
			return StaticModules[i];
		}
	}

	FBehavior * behavior = new FBehavior ();
	if (behavior->Init(lumpnum, fr, len))
	{
		return behavior;
	}
	else
	{
		delete behavior;
		Printf(TEXTCOLOR_RED "%s: invalid ACS module\n", Wads.GetLumpFullName(lumpnum));
		return NULL;
	}
}